

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O0

void __thiscall
dynamicgraph::TimeDependency<int>::addDependencies
          (TimeDependency<int> *this,SignalArray_const<int> *ar)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint local_1c;
  SignalArray_const<int> *pSStack_18;
  uint i;
  SignalArray_const<int> *ar_local;
  TimeDependency<int> *this_local;
  
  local_1c = 0;
  pSStack_18 = ar;
  ar_local = (SignalArray_const<int> *)this;
  while( true ) {
    uVar1 = local_1c;
    uVar2 = (*pSStack_18->_vptr_SignalArray_const[4])();
    if (uVar2 <= uVar1) break;
    iVar3 = (*pSStack_18->_vptr_SignalArray_const[3])(pSStack_18,&local_1c);
    addDependency(this,(SignalBase<int> *)CONCAT44(extraout_var,iVar3));
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void TimeDependency<Time>::addDependencies(const SignalArray_const<Time> &ar) {
  for (unsigned int i = 0; i < ar.getSize(); ++i) {
    addDependency(ar[i]);
  }
}